

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.cc
# Opt level: O1

Vector6d *
gmath::combineError(Vector6d *__return_storage_ptr__,Vector6d *pose0,Vector6d *pose1,
                   Vector6d *pose0_err,Vector6d *pose1_err)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  long lVar5;
  int i;
  long lVar6;
  int i_1;
  int i_2;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar11;
  undefined1 auVar10 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  Vector6d p;
  Vector6d pose;
  Vector6d local_e8;
  Vector6d local_b8;
  Vector6d local_88;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  double dStack_40;
  
  combine(&local_88,pose0,pose1);
  __return_storage_ptr__->v[4] = 0.0;
  __return_storage_ptr__->v[5] = 0.0;
  __return_storage_ptr__->v[2] = 0.0;
  __return_storage_ptr__->v[3] = 0.0;
  __return_storage_ptr__->v[0] = 0.0;
  __return_storage_ptr__->v[1] = 0.0;
  lVar6 = 0;
  do {
    local_e8.v[4] = pose0->v[4];
    local_e8.v[5] = pose0->v[5];
    local_e8.v[2] = pose0->v[2];
    local_e8.v[3] = pose0->v[3];
    local_e8.v[0] = pose0->v[0];
    local_e8.v[1] = pose0->v[1];
    local_e8.v[lVar6] = pose0_err->v[lVar6] + local_e8.v[lVar6];
    combine(&local_b8,&local_e8,pose1);
    dVar12 = local_b8.v[3] - local_88.v[3];
    dVar13 = local_b8.v[4] - local_88.v[4];
    dVar14 = local_b8.v[5] - local_88.v[5];
    if (local_88.v[5] * local_b8.v[5] +
        local_88.v[3] * local_b8.v[3] + local_b8.v[4] * local_88.v[4] < 0.0) {
      dVar4 = local_b8.v[5] * local_b8.v[5] +
              local_b8.v[3] * local_b8.v[3] + local_b8.v[4] * local_b8.v[4];
      if (dVar4 < 0.0) {
        uStack_50 = 0;
        local_58 = dVar14;
        local_48 = dVar12;
        dStack_40 = dVar13;
        dVar4 = sqrt(dVar4);
        dVar12 = local_48;
        dVar13 = dStack_40;
        dVar14 = local_58;
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar7 = dVar4 + -6.283185307179586;
      auVar8._0_8_ = dVar7 * local_b8.v[3];
      auVar8._8_8_ = dVar7 * local_b8.v[4];
      auVar9._8_4_ = SUB84(dVar4,0);
      auVar9._0_8_ = dVar4;
      auVar9._12_4_ = (int)((ulong)dVar4 >> 0x20);
      auVar9 = divpd(auVar8,auVar9);
      dVar4 = (local_b8.v[5] * dVar7) / dVar4 - local_88.v[5];
      dVar7 = auVar9._0_8_ - local_88.v[3];
      dVar11 = auVar9._8_8_ - local_88.v[4];
      if (dVar4 * dVar4 + dVar7 * dVar7 + dVar11 * dVar11 <
          dVar14 * dVar14 + dVar12 * dVar12 + dVar13 * dVar13) {
        dVar12 = dVar7;
        dVar13 = dVar11;
        dVar14 = dVar4;
      }
    }
    local_e8.v[0] = local_b8.v[0] - local_88.v[0];
    local_e8.v[1] = local_b8.v[1] - local_88.v[1];
    local_e8.v[2] = local_b8.v[2] - local_88.v[2];
    local_e8.v[3] = dVar12;
    local_e8.v[4] = dVar13;
    local_e8.v[5] = dVar14;
    lVar5 = 0;
    do {
      dVar12 = local_e8.v[lVar5 + 1] * local_e8.v[lVar5 + 1] +
               (__return_storage_ptr__->v + lVar5)[1];
      auVar1._8_4_ = SUB84(dVar12,0);
      auVar1._0_8_ = local_e8.v[lVar5] * local_e8.v[lVar5] + __return_storage_ptr__->v[lVar5];
      auVar1._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])(__return_storage_ptr__->v + lVar5) = auVar1;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 6);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  lVar6 = 0;
  do {
    local_e8.v[4] = pose1->v[4];
    local_e8.v[5] = pose1->v[5];
    local_e8.v[2] = pose1->v[2];
    local_e8.v[3] = pose1->v[3];
    local_e8.v[0] = pose1->v[0];
    local_e8.v[1] = pose1->v[1];
    local_e8.v[lVar6] = pose1_err->v[lVar6] + local_e8.v[lVar6];
    combine(&local_b8,pose0,&local_e8);
    dVar12 = local_b8.v[3] - local_88.v[3];
    dVar13 = local_b8.v[4] - local_88.v[4];
    dVar14 = local_b8.v[5] - local_88.v[5];
    if (local_88.v[5] * local_b8.v[5] +
        local_88.v[3] * local_b8.v[3] + local_b8.v[4] * local_88.v[4] < 0.0) {
      dVar4 = local_b8.v[5] * local_b8.v[5] +
              local_b8.v[3] * local_b8.v[3] + local_b8.v[4] * local_b8.v[4];
      if (dVar4 < 0.0) {
        uStack_50 = 0;
        local_58 = dVar14;
        local_48 = dVar12;
        dStack_40 = dVar13;
        dVar4 = sqrt(dVar4);
        dVar12 = local_48;
        dVar13 = dStack_40;
        dVar14 = local_58;
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar7 = dVar4 + -6.283185307179586;
      auVar10._0_8_ = dVar7 * local_b8.v[3];
      auVar10._8_8_ = dVar7 * local_b8.v[4];
      auVar2._8_4_ = SUB84(dVar4,0);
      auVar2._0_8_ = dVar4;
      auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
      auVar9 = divpd(auVar10,auVar2);
      dVar4 = (local_b8.v[5] * dVar7) / dVar4 - local_88.v[5];
      dVar7 = auVar9._0_8_ - local_88.v[3];
      dVar11 = auVar9._8_8_ - local_88.v[4];
      if (dVar4 * dVar4 + dVar7 * dVar7 + dVar11 * dVar11 <
          dVar14 * dVar14 + dVar12 * dVar12 + dVar13 * dVar13) {
        dVar12 = dVar7;
        dVar13 = dVar11;
        dVar14 = dVar4;
      }
    }
    local_e8.v[0] = local_b8.v[0] - local_88.v[0];
    local_e8.v[1] = local_b8.v[1] - local_88.v[1];
    local_e8.v[2] = local_b8.v[2] - local_88.v[2];
    local_e8.v[3] = dVar12;
    local_e8.v[4] = dVar13;
    local_e8.v[5] = dVar14;
    lVar5 = 0;
    do {
      dVar12 = local_e8.v[lVar5 + 1] * local_e8.v[lVar5 + 1] +
               (__return_storage_ptr__->v + lVar5)[1];
      auVar3._8_4_ = SUB84(dVar12,0);
      auVar3._0_8_ = local_e8.v[lVar5] * local_e8.v[lVar5] + __return_storage_ptr__->v[lVar5];
      auVar3._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])(__return_storage_ptr__->v + lVar5) = auVar3;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 6);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  lVar6 = 0;
  do {
    dVar12 = __return_storage_ptr__->v[lVar6];
    if (dVar12 < 0.0) {
      dVar12 = sqrt(dVar12);
    }
    else {
      dVar12 = SQRT(dVar12);
    }
    __return_storage_ptr__->v[lVar6] = dVar12;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  return __return_storage_ptr__;
}

Assistant:

Vector6d combineError(const Vector6d &pose0, const Vector6d &pose1,
                      const Vector6d &pose0_err, const Vector6d &pose1_err)
{
  Vector6d pose=combine(pose0, pose1);
  Vector6d perr;

  for (int i=0; i<6; i++)
  {
    Vector6d p=pose0;
    p[i]+=pose0_err[i];

    p=diff(combine(p, pose1), pose);

    for (int k=0; k<6; k++)
    {
      perr[k]+=p[k]*p[k];
    }
  }

  for (int i=0; i<6; i++)
  {
    Vector6d p=pose1;
    p[i]+=pose1_err[i];

    p=diff(combine(pose0, p), pose);

    for (int k=0; k<6; k++)
    {
      perr[k]+=p[k]*p[k];
    }
  }

  for (int i=0; i<6; i++)
  {
    perr[i]=sqrt(perr[i]);
  }

  return perr;
}